

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_spectral_pairs_digital_filter.cc
# Opt level: O2

bool __thiscall
sptk::LineSpectralPairsDigitalFilter::Run
          (LineSpectralPairsDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  double *pdVar4;
  pointer pdVar5;
  bool bVar6;
  int i;
  pointer pdVar7;
  ulong uVar8;
  size_type __new_size;
  int iVar9;
  size_type __new_size_00;
  long lVar10;
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar11;
  double dVar12;
  double dVar13;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if ((buffer != (Buffer *)0x0) && (bVar6 = false, filter_output != (double *)0x0)) {
      lVar10 = (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      __new_size = lVar10 >> 3;
      iVar9 = this->num_filter_order_;
      __new_size_00 = (long)iVar9 + 1;
      bVar6 = false;
      if (__new_size == __new_size_00) {
        if ((long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != lVar10) {
          std::vector<double,_std::allocator<double>_>::resize(&buffer->d1_,__new_size);
          pdVar3 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar7 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
            *pdVar7 = 0.0;
          }
          iVar9 = this->num_filter_order_;
          __new_size_00 = (long)iVar9 + 1;
        }
        if ((long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size_00) {
          std::vector<double,_std::allocator<double>_>::resize(&buffer->d2_,__new_size_00);
          pdVar3 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar7 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start; pdVar7 != pdVar3; pdVar7 = pdVar7 + 1) {
            *pdVar7 = 0.0;
          }
          iVar9 = this->num_filter_order_;
        }
        this_00 = &buffer->ab_;
        if ((long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->ab_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)iVar9) {
          std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar9);
          iVar9 = this->num_filter_order_;
        }
        pdVar11 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        dVar13 = filter_input * *pdVar11;
        if (iVar9 == 0) {
          *filter_output = dVar13;
        }
        else {
          pdVar4 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          while (pdVar11 = pdVar11 + 1, pdVar11 != pdVar4) {
            dVar12 = cos(*pdVar11);
            *pdVar7 = dVar12 * -2.0;
            pdVar7 = pdVar7 + 1;
          }
          pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (buffer->d1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (buffer->d2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar12 = *pdVar5;
          iVar9 = this->num_filter_order_;
          for (lVar10 = 1; dVar1 = pdVar3[lVar10 + -1], lVar10 < iVar9; lVar10 = lVar10 + 2) {
            pdVar3[lVar10] = pdVar7[lVar10 + -1] * dVar1 + pdVar3[lVar10];
            pdVar5[lVar10] = pdVar7[lVar10] * dVar12 + pdVar5[lVar10];
            pdVar3[lVar10 + 1] = dVar1 + pdVar3[lVar10 + 1];
            dVar12 = dVar12 + pdVar5[lVar10 + 1];
            pdVar5[lVar10 + 1] = dVar12;
            dVar13 = dVar13 + pdVar3[lVar10] + pdVar5[lVar10];
          }
          bVar6 = IsEven(iVar9);
          uVar2 = this->num_filter_order_;
          if (bVar6) {
            dVar12 = pdVar3[(int)uVar2];
          }
          else {
            dVar12 = dVar1 * pdVar7[(long)(int)uVar2 + -1] + pdVar3[(int)uVar2];
            pdVar3[(int)uVar2] = dVar12;
          }
          dVar13 = dVar13 + (dVar12 - pdVar5[(int)uVar2]);
          *filter_output = dVar13;
          for (uVar8 = (ulong)uVar2; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
            pdVar3[uVar8] = pdVar3[uVar8 - 1];
            pdVar5[uVar8] = pdVar5[uVar8 - 1];
          }
          dVar13 = dVar13 * -0.5;
          *pdVar3 = dVar13;
          *pdVar5 = dVar13;
        }
        bVar6 = true;
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool LineSpectralPairsDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output,
    LineSpectralPairsDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d1_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d1_.resize(num_filter_order_ + 1);
    std::fill(buffer->d1_.begin(), buffer->d1_.end(), 0.0);
  }
  if (buffer->d2_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d2_.resize(num_filter_order_ + 1);
    std::fill(buffer->d2_.begin(), buffer->d2_.end(), 0.0);
  }
  if (buffer->ab_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->ab_.resize(num_filter_order_);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  std::transform(filter_coefficients.begin() + 1, filter_coefficients.end(),
                 buffer->ab_.begin(),
                 [](double w) { return -2.0 * std::cos(w); });

  const double* ab(&(buffer->ab_[0]));
  double* d1(&buffer->d1_[0]);
  double* d2(&buffer->d2_[0]);

  // Apply LSP synthesis filter.
  double sum(gained_input);
  {
    double x1(d1[0]);
    double x2(d2[0]);
    for (int i(1); i < num_filter_order_; i += 2) {
      d1[i] += x1 * ab[i - 1];
      d2[i] += x2 * ab[i];
      d1[i + 1] += x1;
      d2[i + 1] += x2;
      x1 = d1[i + 1];
      x2 = d2[i + 1];
      sum += d1[i] + d2[i];
    }
    if (!sptk::IsEven(num_filter_order_)) {
      d1[num_filter_order_] += x1 * ab[num_filter_order_ - 1];
    }
    sum += d1[num_filter_order_] - d2[num_filter_order_];
  }

  // Save result.
  *filter_output = sum;

  // Shift stored signals.
  for (int i(num_filter_order_); 0 < i; --i) {
    d1[i] = d1[i - 1];
    d2[i] = d2[i - 1];
  }
  const double delayed_output(-0.5 * sum);
  d1[0] = delayed_output;
  d2[0] = delayed_output;

  return true;
}